

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-agg.cpp
# Opt level: O3

bool __thiscall RasterizerAGG::addPoly(RasterizerAGG *this,Point *poly,size_t count)

{
  AGGRasterizer *this_00;
  undefined1 auVar1 [16];
  undefined4 extraout_EAX;
  undefined4 uVar2;
  uint uVar3;
  undefined4 extraout_EAX_00;
  Point *pPVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (count != 0) {
    this_00 = &this->_rasterizer;
    agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::move_to_d
              (this_00,poly->x,poly->y);
    if (count == 1) {
      if ((this->_rasterizer).m_status != 2) {
        return true;
      }
    }
    else {
      lVar5 = count - 1;
      pPVar4 = poly + 1;
      uVar2 = extraout_EAX;
      do {
        dVar9 = -0.5;
        dVar6 = pPVar4->x * 256.0;
        dVar7 = pPVar4->y * 256.0;
        auVar1._8_8_ = -(ulong)(dVar7 < 0.0);
        auVar1._0_8_ = -(ulong)(dVar6 < 0.0);
        uVar3 = movmskpd(uVar2,auVar1);
        dVar8 = -0.5;
        if ((uVar3 & 1) == 0) {
          dVar8 = 0.5;
        }
        if ((uVar3 & 2) == 0) {
          dVar9 = 0.5;
        }
        agg::rasterizer_sl_clip<agg::ras_conv_int>::line_to<agg::rasterizer_cells_aa<agg::cell_aa>>
                  (&(this->_rasterizer).m_clipper,&this_00->m_outline,(int)(dVar8 + dVar6),
                   (int)(dVar7 + dVar9));
        (this->_rasterizer).m_status = 2;
        pPVar4 = pPVar4 + 1;
        lVar5 = lVar5 + -1;
        uVar2 = extraout_EAX_00;
      } while (lVar5 != 0);
    }
    agg::rasterizer_sl_clip<agg::ras_conv_int>::line_to<agg::rasterizer_cells_aa<agg::cell_aa>>
              (&(this->_rasterizer).m_clipper,&this_00->m_outline,(this->_rasterizer).m_start_x,
               (this->_rasterizer).m_start_y);
    (this->_rasterizer).m_status = 3;
  }
  return true;
}

Assistant:

bool RasterizerAGG::addPoly(const Point* poly, size_t count) noexcept {
  if (!count)
    return true;

  _rasterizer.move_to_d(poly[0].x, poly[0].y);
  for (size_t i = 1; i < count; i++)
    _rasterizer.line_to_d(poly[i].x, poly[i].y);
  _rasterizer.close_polygon();

  return true;
}